

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c
# Opt level: O2

void nn_mutex_reset(nn_mutex *self)

{
  uint uVar1;
  char *pcVar2;
  FILE *pFVar3;
  undefined8 uStack_30;
  
  uVar1 = pthread_mutex_unlock((pthread_mutex_t *)self);
  pFVar3 = _stderr;
  if (uVar1 == 0) {
    pthread_mutex_destroy((pthread_mutex_t *)self);
    uVar1 = pthread_mutex_init((pthread_mutex_t *)self,(pthread_mutexattr_t *)0x0);
    pFVar3 = _stderr;
    if (uVar1 == 0) {
      uVar1 = pthread_mutex_lock((pthread_mutex_t *)self);
      pFVar3 = _stderr;
      if (uVar1 == 0) {
        return;
      }
      pcVar2 = nn_err_strerror(uVar1);
      fprintf(pFVar3,"%s [%d] (%s:%d)\n",pcVar2,(ulong)uVar1,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/utils/mutex.c"
              ,0x61);
      goto LAB_00118233;
    }
    pcVar2 = nn_err_strerror(uVar1);
    uStack_30 = 0x5f;
  }
  else {
    pcVar2 = nn_err_strerror(uVar1);
    uStack_30 = 0x5b;
  }
  fprintf(pFVar3,"%s [%d] (%s:%d)\n",pcVar2,(ulong)uVar1,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/utils/mutex.c"
          ,uStack_30);
LAB_00118233:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void nn_mutex_reset (struct nn_mutex *self)
{
    int rc;

    rc = pthread_mutex_unlock (&self->mutex);
    errnum_assert (rc == 0, rc);
    pthread_mutex_destroy (&self->mutex);

    rc = pthread_mutex_init (&self->mutex, NULL);
    errnum_assert (rc == 0, rc);
    rc = pthread_mutex_lock (&self->mutex);
    errnum_assert (rc == 0, rc);
}